

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O1

bool __thiscall
DIS::RecordSpecification::operator==(RecordSpecification *this,RecordSpecification *rhs)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  pointer pRVar4;
  ulong uVar5;
  
  pRVar4 = (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_recordSets).
      super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar4) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    lVar3 = 0;
    uVar5 = 0;
    do {
      bVar1 = RecordSpecificationElement::operator==
                        ((RecordSpecificationElement *)
                         ((long)&pRVar4->_vptr_RecordSpecificationElement + lVar3),
                         (RecordSpecificationElement *)
                         ((long)&((rhs->_recordSets).
                                  super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_RecordSpecificationElement + lVar3));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar5 = uVar5 + 1;
      pRVar4 = (this->_recordSets).
               super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar5 < (ulong)(((long)(this->_recordSets).
                                    super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool RecordSpecification::operator ==(const RecordSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        if( ! ( _recordSets[idx] == rhs._recordSets[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }